

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int source_set_durable(SOURCE_HANDLE source,terminus_durability durable_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE durable_amqp_value;
  SOURCE_INSTANCE *source_instance;
  int result;
  terminus_durability durable_value_local;
  SOURCE_HANDLE source_local;
  
  if (source == (SOURCE_HANDLE)0x0) {
    source_instance._0_4_ = 0x30e9;
  }
  else {
    item_value = amqpvalue_create_terminus_durability(durable_value);
    if (item_value == (AMQP_VALUE)0x0) {
      source_instance._0_4_ = 0x30f1;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(source->composite_value,1,item_value);
      if (iVar1 == 0) {
        source_instance._0_4_ = 0;
      }
      else {
        source_instance._0_4_ = 0x30f7;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)source_instance;
}

Assistant:

int source_set_durable(SOURCE_HANDLE source, terminus_durability durable_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE durable_amqp_value = amqpvalue_create_terminus_durability(durable_value);
        if (durable_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 1, durable_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(durable_amqp_value);
        }
    }

    return result;
}